

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O3

Parsekey __thiscall
free_format_parser::HMpsFF::parseCols(HMpsFF *this,HighsLogOptions *log_options,istream *file)

{
  pointer *pppVar1;
  iterator iVar2;
  iterator __position;
  iterator iVar3;
  double dVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  Parsekey PVar8;
  int iVar9;
  long lVar10;
  size_t sVar11;
  iterator iVar12;
  pointer pdVar13;
  HighsInt HVar14;
  ulong uVar15;
  HMpsFF *pHVar16;
  ulong uVar17;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>,_bool>
  pVar18;
  bool skip;
  string name;
  string marker;
  string word;
  string strline;
  size_t end;
  string colname;
  vector<int,_std::allocator<int>_> col_index;
  vector<double,_std::allocator<double>_> col_value;
  size_t start;
  bool local_201;
  Parsekey local_200;
  uint local_1fc;
  HighsLogOptions *local_1f8;
  double local_1f0;
  string local_1e8;
  undefined1 local_1c8 [32];
  double local_1a8;
  ulong local_1a0;
  ulong local_198;
  ulong local_190;
  ulong local_188;
  ulong local_180;
  ulong local_178;
  HMpsFF *local_170;
  ulong local_168;
  string local_160;
  string local_140;
  pointer local_120;
  value_type local_118;
  undefined1 local_f8 [32];
  vector<double,_std::allocator<double>_> local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  vector<std::tuple<int,int,double>,std::allocator<std::tuple<int,int,double>>> *local_b0;
  string *local_a8;
  vector<double,std::allocator<double>> *local_a0;
  vector<double,_std::allocator<double>_> *local_98;
  vector<HighsVarType,_std::allocator<HighsVarType>_> *local_90;
  vector<bool,_std::allocator<bool>_> *local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_80;
  key_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  double local_48 [2];
  size_t local_38;
  
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_1f8 = log_options;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  local_140._M_string_length = 0;
  local_140.field_2._M_local_buf[0] = '\0';
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  local_160._M_string_length = 0;
  local_160.field_2._M_local_buf[0] = '\0';
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_f8._16_8_ = 0.0;
  local_f8._0_8_ = (void *)0x0;
  local_f8._8_8_ = 0;
  local_1c8._0_8_ = (HMpsFF *)0x0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (&local_d8,(long)this->num_row,(value_type_conflict1 *)local_1c8);
  pHVar16 = (HMpsFF *)local_f8;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)pHVar16,(long)this->num_row);
  local_170 = (HMpsFF *)&this->rowname2idx;
  local_c0._M_allocated_capacity = (size_type)&this->coeffobj;
  local_b0 = (vector<std::tuple<int,int,double>,std::allocator<std::tuple<int,int,double>>> *)
             &this->entries;
  local_c0._8_8_ = &this->colname2idx;
  local_80 = &this->col_names;
  local_a8 = (string *)&this->duplicate_col_name_;
  local_90 = &this->col_integrality;
  local_88 = &this->col_binary;
  local_98 = &this->col_lower;
  local_a0 = (vector<double,std::allocator<double>> *)&this->col_upper;
  local_1a0 = 1;
  local_1a8 = 0.0;
  local_188 = 0;
  local_198 = 1;
  local_190 = 0;
  local_180 = 1;
  local_178 = 0;
  local_1fc = 0;
  local_168 = 0;
  while( true ) {
    do {
      bVar6 = getMpsLine(pHVar16,file,&local_140,&local_201);
      if (!bVar6) {
        local_200 = kFail;
        goto LAB_001f5671;
      }
    } while (local_201 != false);
    if ((0.0 < this->time_limit_) &&
       (lVar10 = std::chrono::_V2::system_clock::now(),
       dVar4 = (double)lVar10 / 1000000000.0 - this->start_time,
       this->time_limit_ <= dVar4 && dVar4 != this->time_limit_)) {
      local_200 = kTimeout;
      goto LAB_001f5671;
    }
    PVar8 = checkFirstWord(this,&local_140,&local_38,(size_t *)&local_120,&local_160);
    pdVar13 = local_120;
    uVar5 = local_1fc;
    if (PVar8 != kNone) break;
    first_word((string *)local_1c8,&local_140,(size_t)local_120);
    sVar11 = first_word_end(&local_140,(size_t)pdVar13);
    iVar9 = std::__cxx11::string::compare(local_1c8);
    if (iVar9 == 0) {
      first_word(&local_1e8,&local_140,sVar11);
      std::__cxx11::string::operator=((string *)local_1c8,(string *)&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p);
      }
      iVar9 = std::__cxx11::string::compare(local_1c8);
      if (iVar9 != 0) {
        highsLogUser(local_1f8,kError,"Integrality marker error in COLUMNS section of MPS file\n");
        goto LAB_001f506a;
      }
      local_168 = local_168 ^ 1;
      bVar6 = false;
      goto LAB_001f5078;
    }
    if ((sVar11 < 9) &&
       (iVar12 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_170,(key_type *)local_1c8),
       iVar12.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
       ._M_cur == (__node_type *)0x0)) {
      std::__cxx11::string::substr((ulong)&local_1e8,(ulong)&local_140);
      trim(&local_1e8,&default_non_chars_abi_cxx11_);
      std::__cxx11::string::_M_assign((string *)&local_1e8);
      if (local_1e8._M_string_length < 9) {
        this->warning_issued_ = true;
        highsLogUser(local_1f8,kWarning,
                     "Row name \"%s\" with spaces has length %d, so assume fixed format\n",
                     local_1e8._M_dataplus._M_p);
        local_200 = kFixedFormat;
      }
      else {
        highsLogUser(local_1f8,kError,
                     "Row name \"%s\" with spaces exceeds fixed format name length of 8\n",
                     local_1e8._M_dataplus._M_p);
        local_200 = kFail;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p);
      }
LAB_001f5072:
      bVar6 = true;
    }
    else {
      if ((local_160._M_string_length != local_118._M_string_length) ||
         (((char *)local_160._M_string_length != (char *)0x0 &&
          (iVar9 = bcmp(local_160._M_dataplus._M_p,local_118._M_dataplus._M_p,
                        local_160._M_string_length), iVar9 != 0)))) {
        if (this->num_col != 0) {
          if ((local_1a8 != 0.0) || (NAN(local_1a8))) {
            local_1e8._M_dataplus._M_p._0_4_ = this->num_col + -1;
            local_1e8._M_string_length = (size_type)local_1a8;
            iVar2._M_current =
                 (this->coeffobj).
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (this->coeffobj).
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
              _M_realloc_insert<std::pair<int,double>>
                        ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                         local_c0._M_allocated_capacity,iVar2,(pair<int,_double> *)&local_1e8);
            }
            else {
              *(pointer *)iVar2._M_current = local_1e8._M_dataplus._M_p;
              (iVar2._M_current)->second = local_1a8;
              pppVar1 = &(this->coeffobj).
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *pppVar1 = *pppVar1 + 1;
            }
            local_1a8 = 0.0;
          }
          if ((int)local_1fc < 1) {
            local_1fc = 0;
          }
          else {
            uVar17 = (ulong)local_1fc;
            uVar15 = 0;
            do {
              iVar9 = *(int *)(local_f8._0_8_ + uVar15 * 4);
              local_1e8._M_dataplus._M_p =
                   (pointer)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar9];
              local_1e8._M_string_length = CONCAT44(this->num_col + -1,iVar9);
              std::vector<std::tuple<int,int,double>,std::allocator<std::tuple<int,int,double>>>::
              emplace_back<std::tuple<int,int,double>>
                        (local_b0,(tuple<int,_int,_double> *)&local_1e8);
              local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar9] = 0.0;
              uVar15 = uVar15 + 1;
            } while (uVar17 != uVar15);
            local_1fc = 0;
          }
        }
        std::__cxx11::string::_M_assign((string *)&local_118);
        iVar9 = this->num_col;
        this->num_col = iVar9 + 1;
        local_1e8._M_dataplus._M_p._0_4_ = iVar9;
        pVar18 = std::
                 _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                 ::_M_emplace<std::__cxx11::string&,int>
                           ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                             *)local_c0._8_8_,&local_118,&local_1e8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_80,&local_118);
        if ((((undefined1  [16])pVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (this->has_duplicate_col_name_ == false)) {
          this->has_duplicate_col_name_ = true;
          iVar12 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)local_c0._8_8_,&local_118);
          std::__cxx11::string::_M_assign(local_a8);
          this->duplicate_col_name_index0_ =
               *(HighsInt *)
                ((long)iVar12.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                       ._M_cur + 0x28);
          this->duplicate_col_name_index1_ = this->num_col + -1;
        }
        local_1e8._M_dataplus._M_p =
             (pointer)(CONCAT71(local_1e8._M_dataplus._M_p._1_7_,(HighsVarType)local_168) &
                      0xffffffffffffff01);
        __position._M_current =
             (this->col_integrality).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->col_integrality).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<HighsVarType,_std::allocator<HighsVarType>_>::_M_realloc_insert<HighsVarType>
                    (local_90,__position,(HighsVarType *)&local_1e8);
        }
        else {
          *__position._M_current = (HighsVarType)local_168 & kInteger;
          (this->col_integrality).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
          _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        std::vector<bool,_std::allocator<bool>_>::push_back
                  (local_88,(bool)(this->kintegerVarsInColumnsAreBinary & (byte)local_168 & 1));
        local_1e8._M_dataplus._M_p = (pointer)0x0;
        iVar3._M_current =
             (this->col_lower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->col_lower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (local_98,iVar3,(double *)&local_1e8);
        }
        else {
          *iVar3._M_current = 0.0;
          (this->col_lower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        iVar3._M_current =
             (this->col_upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->col_upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (local_a0,iVar3,(double *)&kHighsInf);
        }
        else {
          *iVar3._M_current = INFINITY;
          (this->col_upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
      }
      HVar14 = 0x3cbf27;
      std::__cxx11::string::_M_replace
                ((ulong)&local_160,0,(char *)local_160._M_string_length,0x3cbf27);
      first_word(&local_1e8,&local_140,sVar11);
      std::__cxx11::string::operator=((string *)&local_160,(string *)&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p);
      }
      pdVar13 = (pointer)first_word_end(&local_140,sVar11);
      local_120 = pdVar13;
      iVar9 = std::__cxx11::string::compare((char *)&local_160);
      if (iVar9 == 0) {
        trim((string *)local_1c8,&default_non_chars_abi_cxx11_);
        highsLogUser(local_1f8,kError,"No coefficient given for column \"%s\"\n",local_1c8._0_8_);
LAB_001f506a:
        local_200 = kFail;
        goto LAB_001f5072;
      }
      pHVar16 = local_170;
      iVar12 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_170,(key_type *)local_1c8);
      if (iVar12.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
          ._M_cur == (__node_type *)0x0) {
        local_178 = local_178 + 1;
        if (local_178 % local_180 == 0) {
          highsLogUser(local_1f8,kWarning,
                       "Row name \"%s\" in COLUMNS section is not defined: ignored\n",
                       local_1c8._0_8_);
          local_180 = local_180 * 2;
        }
      }
      else {
        local_1e8._M_dataplus._M_p = local_1e8._M_dataplus._M_p & 0xffffffffffffff00;
        local_1f0 = getValue(pHVar16,&local_160,(bool *)&local_1e8,HVar14);
        if ((char)local_1e8._M_dataplus._M_p == '\x01') {
          highsLogUser(local_1f8,kError,"Coefficient for column \"%s\" is NaN\n",local_1c8._0_8_);
          goto LAB_001f506a;
        }
        if ((local_1f0 != 0.0) || (NAN(local_1f0))) {
          local_58._M_allocated_capacity = (size_type)local_48;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_58,local_1c8._0_8_,
                     (pointer)(local_1c8._0_8_ + local_1c8._8_8_));
          iVar12 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)local_170,(key_type *)&local_58);
          iVar9 = *(int *)((long)iVar12.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                 ._M_cur + 0x28);
          lVar10 = (long)iVar9;
          if (-1 < lVar10) {
            this->num_nz = this->num_nz + 1;
          }
          if ((double *)local_58._M_allocated_capacity != local_48) {
            operator_delete((void *)local_58._M_allocated_capacity);
          }
          if (iVar9 < 0) {
            if (iVar9 == -1) {
              if ((local_1a8 != 0.0) || (NAN(local_1a8))) {
                local_190 = local_190 + 1;
                if (local_190 % local_1a0 == 0) {
                  highsLogUser(local_1f8,kWarning,
                               "Column \"%s\" has duplicate nonzero %g in objective row \"%s\": ignored\n"
                               ,SUB84(local_1f0,0),local_118._M_dataplus._M_p,local_1c8._0_8_);
                  local_1a0 = local_1a0 * 2;
                }
              }
              else {
                local_1a8 = local_1f0;
              }
            }
          }
          else if ((local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar10] != 0.0) ||
                  (NAN(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar10]))) {
            this->num_nz = this->num_nz + -1;
            local_188 = local_188 + 1;
            if (local_188 % local_198 == 0) {
              highsLogUser(local_1f8,kWarning,
                           "Column \"%s\" has duplicate nonzero %g in row \"%s\": ignored\n",
                           SUB84(local_1f0,0),local_118._M_dataplus._M_p,local_1c8._0_8_);
              local_198 = local_198 * 2;
            }
          }
          else {
            local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar10] = local_1f0;
            lVar10 = (long)(int)local_1fc;
            local_1fc = local_1fc + 1;
            *(int *)(local_f8._0_8_ + lVar10 * 4) = iVar9;
          }
        }
      }
      bVar7 = is_end(&local_140,(size_t)pdVar13,&default_non_chars_abi_cxx11_);
      bVar6 = false;
      if (!bVar7) {
        first_word(&local_1e8,&local_140,(size_t)pdVar13);
        std::__cxx11::string::operator=((string *)local_1c8,(string *)&local_1e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p);
        }
        iVar9 = std::__cxx11::string::compare((char *)&local_160);
        if (iVar9 == 0) {
          trim((string *)local_1c8,&default_non_chars_abi_cxx11_);
          highsLogUser(local_1f8,kError,"No coefficient given for column \"%s\"\n",local_1c8._0_8_);
          goto LAB_001f506a;
        }
        sVar11 = first_word_end(&local_140,(size_t)pdVar13);
        HVar14 = 0x3cbf27;
        std::__cxx11::string::_M_replace
                  ((ulong)&local_160,0,(char *)local_160._M_string_length,0x3cbf27);
        first_word(&local_1e8,&local_140,sVar11 + 1);
        std::__cxx11::string::operator=((string *)&local_160,(string *)&local_1e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p);
        }
        local_120 = (pointer)first_word_end(&local_140,sVar11 + 1);
        pHVar16 = local_170;
        iVar12 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_170,(key_type *)local_1c8);
        if (iVar12.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
            ._M_cur == (__node_type *)0x0) {
          local_178 = local_178 + 1;
          bVar6 = false;
          if (local_178 % local_180 == 0) {
            highsLogUser(local_1f8,kWarning,
                         "Row name \"%s\" in COLUMNS section is not defined: ignored\n",
                         local_1c8._0_8_);
            local_180 = local_180 * 2;
          }
        }
        else {
          local_1e8._M_dataplus._M_p = local_1e8._M_dataplus._M_p & 0xffffffffffffff00;
          local_1f0 = getValue(pHVar16,&local_160,(bool *)&local_1e8,HVar14);
          if ((char)local_1e8._M_dataplus._M_p == '\x01') {
            highsLogUser(local_1f8,kError,"Coefficient for column \"%s\" is NaN\n",local_1c8._0_8_);
            goto LAB_001f506a;
          }
          bVar7 = false;
          if ((local_1f0 != 0.0) || (bVar6 = false, NAN(local_1f0))) {
            local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_78,local_1c8._0_8_,
                       (pointer)(local_1c8._0_8_ + local_1c8._8_8_));
            iVar12 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)local_170,&local_78);
            iVar9 = *(int *)((long)iVar12.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                   ._M_cur + 0x28);
            lVar10 = (long)iVar9;
            if (-1 < lVar10) {
              this->num_nz = this->num_nz + 1;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p);
            }
            bVar6 = bVar7;
            if (iVar9 < 0) {
              if (iVar9 == -1) {
                if ((local_1a8 != 0.0) || (NAN(local_1a8))) {
                  local_190 = local_190 + 1;
                  bVar6 = false;
                  if (local_190 % local_1a0 == 0) {
                    highsLogUser(local_1f8,kWarning,
                                 "Column \"%s\" has duplicate nonzero %g in objective row \"%s\": ignored\n"
                                 ,SUB84(local_1f0,0),local_118._M_dataplus._M_p,
                                 (this->objective_name)._M_dataplus._M_p);
                    local_1a0 = local_1a0 * 2;
                  }
                }
                else {
                  local_1a8 = local_1f0;
                }
              }
            }
            else if ((local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar10] != 0.0) ||
                    (NAN(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar10]))) {
              this->num_nz = this->num_nz + -1;
              local_188 = local_188 + 1;
              bVar6 = false;
              if (local_188 % local_198 == 0) {
                highsLogUser(local_1f8,kWarning,
                             "Column \"%s\" has duplicate nonzero %g in row \"%s\": ignored\n",
                             SUB84(local_1f0,0),local_118._M_dataplus._M_p,local_1c8._0_8_);
                local_198 = local_198 * 2;
                bVar6 = false;
              }
            }
            else {
              local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar10] = local_1f0;
              lVar10 = (long)(int)local_1fc;
              local_1fc = local_1fc + 1;
              *(int *)(local_f8._0_8_ + lVar10 * 4) = iVar9;
            }
          }
        }
      }
    }
LAB_001f5078:
    pHVar16 = (HMpsFF *)local_1c8._0_8_;
    if ((HMpsFF *)local_1c8._0_8_ != (HMpsFF *)(local_1c8 + 0x10)) {
      operator_delete((void *)local_1c8._0_8_);
    }
    if (bVar6) goto LAB_001f5671;
  }
  if (this->num_col != 0) {
    if ((local_1a8 != 0.0) || (NAN(local_1a8))) {
      local_1c8._0_4_ = this->num_col + -1;
      local_1c8._8_8_ = local_1a8;
      iVar2._M_current =
           (this->coeffobj).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->coeffobj).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
        _M_realloc_insert<std::pair<int,double>>
                  ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                   local_c0._M_allocated_capacity,iVar2,(pair<int,_double> *)local_1c8);
      }
      else {
        *(undefined8 *)iVar2._M_current = local_1c8._0_8_;
        (iVar2._M_current)->second = local_1a8;
        pppVar1 = &(this->coeffobj).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + 1;
      }
    }
    if (0 < (int)uVar5) {
      uVar15 = 0;
      do {
        iVar9 = *(int *)(local_f8._0_8_ + uVar15 * 4);
        local_1c8._0_8_ =
             local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar9];
        local_1c8._12_4_ = this->num_col + -1;
        local_1c8._8_4_ = iVar9;
        std::vector<std::tuple<int,int,double>,std::allocator<std::tuple<int,int,double>>>::
        emplace_back<std::tuple<int,int,double>>(local_b0,(tuple<int,_int,_double> *)local_1c8);
        local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[iVar9] = 0.0;
        uVar15 = uVar15 + 1;
      } while (uVar5 != uVar15);
    }
  }
  this->warning_issued_ = (local_178 != 0 || local_190 != 0) || local_188 != 0;
  if ((local_178 != 0 || local_190 != 0) || local_188 != 0) {
    highsLogUser(local_1f8,kWarning,
                 "COLUMNS section: ignored %d undefined rows %d duplicate cost values and %d duplicate matrix values\n"
                 ,local_178,local_190,local_188);
  }
  highsLogDev(local_1f8,kInfo,"readMPS: Read COLUMNS OK\n");
  local_200 = PVar8;
LAB_001f5671:
  if ((void *)local_f8._0_8_ != (void *)0x0) {
    operator_delete((void *)local_f8._0_8_);
  }
  PVar8 = local_200;
  if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  return PVar8;
}

Assistant:

typename HMpsFF::Parsekey HMpsFF::parseCols(const HighsLogOptions& log_options,
                                            std::istream& file) {
  std::string colname = "";
  std::string strline, word;
  HighsInt rowidx;
  size_t start, end;
  bool integral_cols = false;
  assert(num_col == 0);
  // Define the scattered value vector, index vector and count
  std::vector<double> col_value;
  std::vector<HighsInt> col_index;
  HighsInt col_count = 0;
  double col_cost = 0;
  col_value.assign(num_row, 0);
  col_index.resize(num_row);

  auto parseName = [&rowidx, this](std::string name) {
    auto mit = rowname2idx.find(name);

    assert(mit != rowname2idx.end());
    rowidx = mit->second;

    if (rowidx >= 0)
      this->num_nz++;
    else
      assert(-1 == rowidx || -2 == rowidx);
  };

  bool skip;
  size_t num_ignored_row_name = 0;
  size_t report_ignored_row_name_frequency = 1;
  size_t num_ignored_duplicate_cost_nz = 0;
  size_t report_ignored_duplicate_cost_nz_frequency = 1;
  size_t num_ignored_duplicate_matrix_nz = 0;
  size_t report_ignored_duplicate_matrix_nz_frequency = 1;
  while (getMpsLine(file, strline, skip)) {
    if (skip) continue;
    if (timeout()) return HMpsFF::Parsekey::kTimeout;

    HMpsFF::Parsekey key = checkFirstWord(strline, start, end, word);

    // start of new section?
    if (key != Parsekey::kNone) {
      if (num_col) {
        if (col_cost) {
          coeffobj.push_back(std::make_pair(num_col - 1, col_cost));
          col_cost = 0;
        }
        for (HighsInt iEl = 0; iEl < col_count; iEl++) {
          const HighsInt iRow = col_index[iEl];
          assert(col_value[iRow]);
          entries.push_back(
              std::make_tuple(num_col - 1, iRow, col_value[iRow]));
          col_value[iRow] = 0;
        }
        col_count = 0;
      }

      warning_issued_ = num_ignored_row_name > 0 ||
                        num_ignored_duplicate_cost_nz > 0 ||
                        num_ignored_duplicate_matrix_nz > 0;
      if (warning_issued_)
        highsLogUser(log_options, HighsLogType::kWarning,
                     "COLUMNS section: ignored %d undefined rows %d duplicate "
                     "cost values and %d duplicate matrix values\n",
                     int(num_ignored_row_name),
                     int(num_ignored_duplicate_cost_nz),
                     int(num_ignored_duplicate_matrix_nz));
      highsLogDev(log_options, HighsLogType::kInfo,
                  "readMPS: Read COLUMNS OK\n");
      return key;
    }

    // check for integrality marker
    std::string marker = first_word(strline, end);
    size_t end_marker = first_word_end(strline, end);

    if (marker == "'MARKER'") {
      marker = first_word(strline, end_marker);

      if ((integral_cols && marker != "'INTEND'") ||
          (!integral_cols && marker != "'INTORG'")) {
        highsLogUser(
            log_options, HighsLogType::kError,
            "Integrality marker error in COLUMNS section of MPS file\n");
        return Parsekey::kFail;
      }
      integral_cols = !integral_cols;

      continue;
    }
    // Detect whether the file is in fixed format with spaces in
    // names, even if there are no known examples!
    //
    // end_marker should be the end index of the row name:
    //
    // If the names are at least 8 characters, end_marker should be
    // more than 13 minus the 4 whitespaces we have trimmed from the
    // start so more than 9
    //
    // However, free format MPS can have names with only one character
    // (pyomo.mps). Have to distinguish this from 8-character names
    // with spaces. Best bet is to see whether "marker" is in the set
    // of row names. If it is, then assume that the names are short
    if (end_marker < 9) {
      auto mit = rowname2idx.find(marker);
      if (mit == rowname2idx.end()) {
        // marker is not a row name, so continue to look at name
        std::string name = strline.substr(0, 10);
        // Delete trailing spaces
        name = trim(name);
        if (name.size() > 8) {
          highsLogUser(log_options, HighsLogType::kError,
                       "Row name \"%s\" with spaces exceeds fixed format name "
                       "length of 8\n",
                       name.c_str());
          return HMpsFF::Parsekey::kFail;
        } else {
          warning_issued_ = true;
          highsLogUser(log_options, HighsLogType::kWarning,
                       "Row name \"%s\" with spaces has length %d, so assume "
                       "fixed format\n",
                       name.c_str(), (int)name.size());
          return HMpsFF::Parsekey::kFixedFormat;
        }
      }
    }

    // Test for new column
    if (!(word == colname)) {
      // Record the nonzeros in any previous column
      if (num_col) {
        if (col_cost) {
          coeffobj.push_back(std::make_pair(num_col - 1, col_cost));
          col_cost = 0;
        }
        for (HighsInt iEl = 0; iEl < col_count; iEl++) {
          const HighsInt iRow = col_index[iEl];
          assert(col_value[iRow]);
          entries.push_back(
              std::make_tuple(num_col - 1, iRow, col_value[iRow]));
          col_value[iRow] = 0;
        }
        col_count = 0;
      }
      assert(!col_cost);
      colname = word;
      auto ret = colname2idx.emplace(colname, num_col++);
      col_names.push_back(colname);
      if (!ret.second) {
        // Duplicate col name
        if (!has_duplicate_col_name_) {
          // This is the first so record it
          has_duplicate_col_name_ = true;
          auto mit = colname2idx.find(colname);
          assert(mit != colname2idx.end());
          duplicate_col_name_ = colname;
          duplicate_col_name_index0_ = mit->second;
          duplicate_col_name_index1_ = num_col - 1;
        }
      }

      // Mark the column as integer, according to whether
      // the integral_cols flag is set
      col_integrality.push_back(integral_cols ? HighsVarType::kInteger
                                              : HighsVarType::kContinuous);
      // Mark the column as binary as well
      col_binary.push_back(integral_cols && kintegerVarsInColumnsAreBinary);

      // initialize with default bounds
      col_lower.push_back(0.0);
      col_upper.push_back(kHighsInf);
    }

    assert(num_col > 0);

    // here marker is the row name and end marks its end
    word = "";
    word = first_word(strline, end_marker);
    end = first_word_end(strline, end_marker);

    if (word == "") {
      trim(marker);
      highsLogUser(log_options, HighsLogType::kError,
                   "No coefficient given for column \"%s\"\n", marker.c_str());
      return HMpsFF::Parsekey::kFail;
    }

    auto mit = rowname2idx.find(marker);
    if (mit == rowname2idx.end()) {
      num_ignored_row_name++;
      if (num_ignored_row_name % report_ignored_row_name_frequency == 0) {
        highsLogUser(
            log_options, HighsLogType::kWarning,
            "Row name \"%s\" in COLUMNS section is not defined: ignored\n",
            marker.c_str());
        report_ignored_row_name_frequency *= 2;
      }
    } else {
      bool is_nan = false;
      double value = getValue(word, is_nan);  // atof(word.c_str());
      if (is_nan) {
        highsLogUser(log_options, HighsLogType::kError,
                     "Coefficient for column \"%s\" is NaN\n", marker.c_str());
        return HMpsFF::Parsekey::kFail;
      }
      if (value) {
        parseName(marker);  // rowidx set and num_nz incremented
        if (rowidx >= 0) {
          if (col_value[rowidx]) {
            // Ignore duplicate entry
            num_nz--;
            num_ignored_duplicate_matrix_nz++;
            if (num_ignored_duplicate_matrix_nz %
                    report_ignored_duplicate_matrix_nz_frequency ==
                0) {
              highsLogUser(log_options, HighsLogType::kWarning,
                           "Column \"%s\" has duplicate nonzero %g in row "
                           "\"%s\": ignored\n",
                           colname.c_str(), value, marker.c_str());
              report_ignored_duplicate_matrix_nz_frequency *= 2;
            }
          } else {
            col_value[rowidx] = value;
            col_index[col_count++] = rowidx;
          }
        } else if (rowidx == -1) {
          // Ignore duplicate entry
          if (col_cost) {
            num_ignored_duplicate_cost_nz++;
            if (num_ignored_duplicate_cost_nz %
                    report_ignored_duplicate_cost_nz_frequency ==
                0) {
              highsLogUser(log_options, HighsLogType::kWarning,
                           "Column \"%s\" has duplicate nonzero %g in "
                           "objective row \"%s\": ignored\n",
                           colname.c_str(), value, marker.c_str());
              report_ignored_duplicate_cost_nz_frequency *= 2;
            }
          } else {
            col_cost = value;
          }
        }
      }
    }

    if (!is_end(strline, end)) {
      // parse second coefficient
      marker = first_word(strline, end);
      if (word == "") {
        trim(marker);
        highsLogUser(log_options, HighsLogType::kError,
                     "No coefficient given for column \"%s\"\n",
                     marker.c_str());
        return HMpsFF::Parsekey::kFail;
      }
      end_marker = first_word_end(strline, end);

      // here marker is the row name and end marks its end
      word = "";
      end_marker++;
      word = first_word(strline, end_marker);
      end = first_word_end(strline, end_marker);

      assert(is_end(strline, end));

      auto mit = rowname2idx.find(marker);
      if (mit == rowname2idx.end()) {
        num_ignored_row_name++;
        if (num_ignored_row_name % report_ignored_row_name_frequency == 0) {
          highsLogUser(
              log_options, HighsLogType::kWarning,
              "Row name \"%s\" in COLUMNS section is not defined: ignored\n",
              marker.c_str());
          report_ignored_row_name_frequency *= 2;
        }
        continue;
      };
      bool is_nan = false;
      double value = getValue(word, is_nan);  // atof(word.c_str());
      if (is_nan) {
        highsLogUser(log_options, HighsLogType::kError,
                     "Coefficient for column \"%s\" is NaN\n", marker.c_str());
        return HMpsFF::Parsekey::kFail;
      }
      if (value) {
        parseName(marker);  // rowidx set and num_nz incremented
        if (rowidx >= 0) {
          if (col_value[rowidx]) {
            // Ignore duplicate entry
            num_nz--;
            num_ignored_duplicate_matrix_nz++;
            if (num_ignored_duplicate_matrix_nz %
                    report_ignored_duplicate_matrix_nz_frequency ==
                0) {
              highsLogUser(log_options, HighsLogType::kWarning,
                           "Column \"%s\" has duplicate nonzero %g in row "
                           "\"%s\": ignored\n",
                           colname.c_str(), value, marker.c_str());
              report_ignored_duplicate_matrix_nz_frequency *= 2;
            }
          } else {
            col_value[rowidx] = value;
            col_index[col_count++] = rowidx;
          }
        } else if (rowidx == -1) {
          // Ignore duplicate entry
          if (col_cost) {
            num_ignored_duplicate_cost_nz++;
            if (num_ignored_duplicate_cost_nz %
                    report_ignored_duplicate_cost_nz_frequency ==
                0) {
              highsLogUser(log_options, HighsLogType::kWarning,
                           "Column \"%s\" has duplicate nonzero %g in "
                           "objective row \"%s\": ignored\n",
                           colname.c_str(), value, objective_name.c_str());
              report_ignored_duplicate_cost_nz_frequency *= 2;
            }
          } else {
            col_cost = value;
          }
        }
      }
    }
  }

  return Parsekey::kFail;
}